

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

void __thiscall
helics::PublicationInfo::setProperty(PublicationInfo *this,int32_t option,int32_t value)

{
  bool bVar1;
  
  bVar1 = value != 0;
  if (option < 0x1c4) {
    switch(option) {
    case 0x192:
      this->required = value == 0;
      return;
    case 0x193:
    case 0x194:
    case 0x195:
    case 0x196:
    case 0x198:
    case 0x19a:
      break;
    case 0x197:
    case 0x199:
      this->requiredConnections = (uint)(value != 0);
      return;
    case 0x19b:
      this->buffer_data = bVar1;
      return;
    default:
      if (option == 0x18d) {
        this->required = bVar1;
        return;
      }
    }
  }
  else if (option == 0x22d) {
    (this->minTimeGap).internalTimeCode = (long)value * 1000000;
  }
  else {
    if (option == 0x20a) {
      this->requiredConnections = value;
      return;
    }
    if (option == 0x1c4) {
      this->only_update_on_change = bVar1;
      return;
    }
  }
  return;
}

Assistant:

void PublicationInfo::setProperty(int32_t option, int32_t value)
{
    bool bvalue = (value != 0);
    switch (option) {
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            only_update_on_change = bvalue;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            required = bvalue;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            required = !bvalue;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            requiredConnections = bvalue ? 1 : 0;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            requiredConnections = !bvalue ? 0 : 1;
            break;
        case defs::Options::BUFFER_DATA:
            buffer_data = bvalue;
            break;
        case defs::Options::CONNECTIONS:
            requiredConnections = value;
            break;
        case defs::Options::TIME_RESTRICTED:
            minTimeGap = Time(value, time_units::ms);
            break;
        default:
            break;
    }
}